

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monsters.cpp
# Opt level: O0

void __thiscall MonsterThing::MonsterThing(MonsterThing *this)

{
  MonsterThing *this_local;
  
  std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::list(&this->pack);
  (this->pos).y = 0;
  (this->pos).x = 0;
  this->turn_delay = 0;
  this->type = '\0';
  this->disguise = '\0';
  this->dest = (coord *)0x0;
  this->flags = 0;
  (this->stats).s_str = 0;
  (this->stats).s_exp = 0;
  (this->stats).s_lvl = 0;
  (this->stats).s_arm = 0;
  (this->stats).s_hpt = 0;
  (this->stats).s_dmg[0] = '\0';
  (this->stats).s_maxhp = 0;
  this->reserved = 0;
  return;
}

Assistant:

MonsterThing::MonsterThing()
{
    pos.x = pos.y = 0;                        /* Position */
    turn_delay = 0;
    type = 0;                        /* What it is */
    disguise = 0;                /* What mimic looks like */
    dest = nullptr;                        /* Where it is running to */
    flags = 0;                        /* State word */
    stats.s_str = 0;                        /* Strength */
    stats.s_exp = 0;                                /* Experience */
    stats.s_lvl = 0;                                /* level of mastery */
    stats.s_arm = 0;                                /* Armor class */
    stats.s_hpt = 0;                        /* Hit points */
    stats.s_dmg[0] = 0;                        /* String describing damage done */
    stats.s_maxhp = 0;                        /* Max hit points */
    reserved = 0;
}